

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_relax_snode.h
# Opt level: O2

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::relax_snode
          (SparseLUImpl<double,_int> *this,int n,IndexVector *et,int relax_columns,
          IndexVector *descendants,IndexVector *relax_end)

{
  int iVar1;
  Scalar *pSVar2;
  long index;
  ulong index_00;
  Index index_01;
  int iVar3;
  ulong uVar4;
  long lVar5;
  Scalar local_54;
  long local_50;
  DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *local_48;
  DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *local_40;
  int local_38;
  int local_34;
  
  local_54 = -1;
  local_48 = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)relax_end;
  local_40 = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)et;
  local_38 = relax_columns;
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)relax_end,&local_54);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)descendants);
  index_00 = 0;
  uVar4 = 0;
  local_34 = n;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  for (; uVar4 != index_00; index_00 = index_00 + 1) {
    pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()(local_40,index_00);
    iVar3 = *pSVar2;
    if (iVar3 != local_34) {
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)descendants,
                          index_00);
      iVar1 = *pSVar2;
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)descendants,
                          (long)iVar3);
      *pSVar2 = *pSVar2 + iVar1 + 1;
    }
  }
  lVar5 = (long)local_34;
  iVar3 = 0;
  do {
    if (local_34 <= iVar3) {
      return;
    }
    index_01 = (Index)iVar3;
    iVar1 = iVar3;
    local_50 = index_01;
    do {
      iVar3 = iVar1;
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (local_40,index_01);
      iVar1 = *pSVar2;
      if (iVar1 == local_34) break;
      index_01 = (Index)iVar1;
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)descendants,
                          index_01);
    } while (*pSVar2 < local_38);
    pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()(local_48,local_50);
    *pSVar2 = iVar3;
    index = (long)iVar3;
    do {
      index = index + 1;
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)descendants,
                          index);
      iVar3 = iVar3 + 1;
      if (lVar5 <= index) break;
    } while (*pSVar2 != 0);
  } while( true );
}

Assistant:

void SparseLUImpl<Scalar,Index>::relax_snode (const Index n, IndexVector& et, const Index relax_columns, IndexVector& descendants, IndexVector& relax_end)
{
  
  // compute the number of descendants of each node in the etree
  Index j, parent; 
  relax_end.setConstant(emptyIdxLU);
  descendants.setZero();
  for (j = 0; j < n; j++) 
  {
    parent = et(j);
    if (parent != n) // not the dummy root
      descendants(parent) += descendants(j) + 1;
  }
  // Identify the relaxed supernodes by postorder traversal of the etree
  Index snode_start; // beginning of a snode 
  for (j = 0; j < n; )
  {
    parent = et(j);
    snode_start = j; 
    while ( parent != n && descendants(parent) < relax_columns ) 
    {
      j = parent; 
      parent = et(j);
    }
    // Found a supernode in postordered etree, j is the last column 
    relax_end(snode_start) = j; // Record last column
    j++;
    // Search for a new leaf
    while (descendants(j) != 0 && j < n) j++;
  } // End postorder traversal of the etree
  
}